

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  int iVar1;
  char *pcVar2;
  char *filename;
  luaL_Buffer msg;
  char *dirsep_local;
  char *sep_local;
  char *path_local;
  char *name_local;
  lua_State *L_local;
  
  msg.initb._8184_8_ = dirsep;
  luaL_buffinit(L,(luaL_Buffer *)&filename);
  sep_local = path;
  path_local = name;
  if (*sep != '\0') {
    path_local = luaL_gsub(L,name,sep,(char *)msg.initb._8184_8_);
  }
  while( true ) {
    sep_local = pushnexttemplate(L,sep_local);
    if (sep_local == (char *)0x0) {
      luaL_pushresult((luaL_Buffer *)&filename);
      return (char *)0x0;
    }
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = luaL_gsub(L,pcVar2,"?",path_local);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    iVar1 = readable(pcVar2);
    if (iVar1 != 0) break;
    lua_pushfstring(L,"\n\tno file \'%s\'",pcVar2);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    luaL_addvalue((luaL_Buffer *)&filename);
  }
  return pcVar2;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
                                             const char *path,
                                             const char *sep,
                                             const char *dirsep) {
  luaL_Buffer buff;
  char *pathname;  /* path with name inserted */
  char *endpathname;  /* its end */
  const char *filename;
  /* separator is non-empty and appears in 'name'? */
  if (*sep != '\0' && strchr(name, *sep) != NULL)
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  luaL_buffinit(L, &buff);
  /* add path to the buffer, replacing marks ('?') with the file name */
  luaL_addgsub(&buff, path, LUA_PATH_MARK, name);
  luaL_addchar(&buff, '\0');
  pathname = luaL_buffaddr(&buff);  /* writable list of file names */
  endpathname = pathname + luaL_bufflen(&buff) - 1;
  while ((filename = getnextfilename(&pathname, endpathname)) != NULL) {
    if (readable(filename))  /* does file exist and is readable? */
      return lua_pushstring(L, filename);  /* save and return name */
  }
  luaL_pushresult(&buff);  /* push path to create error message */
  pusherrornotfound(L, lua_tostring(L, -1));  /* create error message */
  return NULL;  /* not found */
}